

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPFakeTransmitter::GetLocalIPList_DNS(RTPFakeTransmitter *this)

{
  bool bVar1;
  int local_428;
  int local_424;
  int j;
  int i;
  char local_418 [3];
  bool done;
  uint32_t ip;
  char name [1024];
  hostent *he;
  RTPFakeTransmitter *this_local;
  
  gethostname(local_418,0x3ff);
  name[0x3f7] = '\0';
  name._1016_8_ = gethostbyname(local_418);
  if ((hostent *)name._1016_8_ != (hostent *)0x0) {
    local_424 = 0;
    bVar1 = false;
    while (!bVar1) {
      if (*(long *)(*(long *)(name._1016_8_ + 0x18) + (long)local_424 * 8) == 0) {
        bVar1 = true;
      }
      else {
        i = 0;
        for (local_428 = 0; local_428 < 4; local_428 = local_428 + 1) {
          i = (uint)*(byte *)(*(long *)(*(long *)(name._1016_8_ + 0x18) + (long)local_424 * 8) +
                             (long)local_428) << (('\x03' - (char)local_428) * '\b' & 0x1fU) | i;
        }
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->localIPs,(value_type_conflict1 *)&i);
        local_424 = local_424 + 1;
      }
    }
  }
  return;
}

Assistant:

void RTPFakeTransmitter::GetLocalIPList_DNS()
{
	struct hostent *he;
	char name[1024];
	uint32_t ip;
	bool done;
	int i,j;

	gethostname(name,1023);
	name[1023] = 0;
	he = gethostbyname(name);
	if (he == 0)
		return;
	
	ip = 0;
	i = 0;
	done = false;
	while (!done)
	{
		if (he->h_addr_list[i] == NULL)
			done = true;
		else
		{
			ip = 0;
			for (j = 0 ; j < 4 ; j++)
				ip |= ((uint32_t)((unsigned char)he->h_addr_list[i][j])<<((3-j)*8));
			localIPs.push_back(ip);
			i++;
		}
	}
}